

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::setCharAt(UnicodeString *this,int32_t offset,UChar c)

{
  short sVar1;
  UBool UVar2;
  ulong uVar3;
  uint uVar4;
  char16_t *pcVar5;
  int32_t iVar6;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  UVar2 = cloneArrayIfNeeded(this,-1,-1,'\x01',(int32_t **)0x0,'\0');
  if ((UVar2 != '\0') && (0 < iVar6)) {
    uVar4 = iVar6 - 1;
    if (offset < iVar6) {
      uVar4 = offset;
    }
    uVar3 = 0;
    if (-1 < offset) {
      uVar3 = (ulong)uVar4;
    }
    if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      pcVar5 = (this->fUnion).fFields.fArray;
    }
    else {
      pcVar5 = (char16_t *)((long)&this->fUnion + 2);
    }
    pcVar5[uVar3] = c;
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::setCharAt(int32_t offset,
             UChar c)
{
  int32_t len = length();
  if(cloneArrayIfNeeded() && len > 0) {
    if(offset < 0) {
      offset = 0;
    } else if(offset >= len) {
      offset = len - 1;
    }

    getArrayStart()[offset] = c;
  }
  return *this;
}